

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_nw_diag_avx2_256_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint uVar10;
  uint uVar11;
  int iVar12;
  parasail_result_t *ppVar13;
  undefined1 (*ptr) [16];
  int8_t *ptr_00;
  int8_t *ptr_01;
  ulong uVar14;
  long lVar15;
  char cVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  char cVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  uint local_314;
  uint local_310;
  uint local_300;
  uint local_2f8;
  uint local_2f0;
  uint local_2e8;
  uint local_2d8;
  int8_t *local_2b8;
  undefined1 local_298 [32];
  undefined1 local_1d8 [32];
  undefined1 auVar42 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_nw_diag_avx2_256_8_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_diag_avx2_256_8_cold_6();
  }
  else if (open < 0) {
    parasail_nw_diag_avx2_256_8_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_diag_avx2_256_8_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_diag_avx2_256_8_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_diag_avx2_256_8_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar32 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_diag_avx2_256_8_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar32 = (ulong)(uint)matrix->length;
    }
    auVar37._4_4_ = gap;
    auVar37._0_4_ = gap;
    auVar37._8_4_ = gap;
    auVar37._12_4_ = gap;
    auVar50._16_4_ = gap;
    auVar50._0_16_ = auVar37;
    auVar50._20_4_ = gap;
    auVar50._24_4_ = gap;
    auVar50._28_4_ = gap;
    auVar33 = vpinsrd_avx(auVar37,gap,1);
    auVar33 = vpinsrd_avx(auVar33,gap,2);
    auVar33 = vpinsrd_avx(auVar33,open,3);
    auVar34._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar37;
    auVar34._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * auVar33;
    auVar34 = vpmulld_avx2(auVar34,_DAT_009092e0);
    uVar18 = auVar34._28_4_;
    uVar10 = (uint)(byte)-(char)matrix->min;
    if ((int)uVar18 < matrix->min) {
      uVar10 = open;
    }
    cVar21 = '~' - (char)matrix->max;
    auVar33 = in_ZMM9._0_16_;
    auVar58 = in_ZMM10._0_16_;
    ppVar13 = parasail_result_new();
    if (ppVar13 != (parasail_result_t *)0x0) {
      ppVar13->flag = ppVar13->flag | 0x20101001;
      uVar14 = (ulong)(s2Len + 0x3e);
      ptr = (undefined1 (*) [16])parasail_memalign_int8_t(0x20,uVar14);
      ptr_00 = parasail_memalign_int8_t(0x20,uVar14);
      ptr_01 = parasail_memalign_int8_t(0x20,uVar14);
      if (ptr_01 != (int8_t *)0x0 && (ptr_00 != (int8_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
        uVar25 = (uint)uVar32;
        if (matrix->type == 0) {
          iVar24 = uVar25 + 0x1f;
          local_2b8 = parasail_memalign_int8_t(0x20,(long)iVar24);
          if (local_2b8 == (int8_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar25) {
            uVar14 = 0;
            do {
              local_2b8[uVar14] = (int8_t)matrix->mapper[(byte)_s1[uVar14]];
              uVar14 = uVar14 + 1;
            } while (uVar32 != uVar14);
          }
          iVar12 = uVar25 + 1;
          if ((int)(uVar25 + 1) < iVar24) {
            iVar12 = iVar24;
          }
          memset(local_2b8 + (int)uVar25,0,(ulong)(~uVar25 + iVar12) + 1);
        }
        else {
          local_2b8 = (int8_t *)0x0;
        }
        auVar3 = vpmulld_avx(auVar37,_DAT_00904d90);
        auVar41._4_4_ = open;
        auVar41._0_4_ = open;
        auVar41._8_4_ = open;
        auVar41._12_4_ = open;
        auVar42._16_4_ = open;
        auVar42._0_16_ = auVar41;
        auVar42._20_4_ = open;
        auVar42._24_4_ = open;
        auVar42._28_4_ = open;
        auVar37 = vpinsrd_avx(auVar41,open,1);
        auVar37 = vpinsrd_avx(auVar37,open,2);
        auVar2 = vpinsrd_avx(auVar37,gap << 4,3);
        auVar37 = vpsubd_avx(auVar3,auVar41);
        auVar37 = vpshufb_avx(auVar37,_DAT_00906f80);
        auVar37 = vpinsrb_avx(auVar37,gap * 0xf5 - open,4);
        auVar37 = vpinsrb_avx(auVar37,gap * 0xf6 - open,5);
        auVar37 = vpinsrb_avx(auVar37,gap * 0xf7 - open,6);
        auVar37 = vpinsrb_avx(auVar37,uVar18 + gap * -8,7);
        auVar37 = vpinsrb_avx(auVar37,gap * 0xf9 - open,8);
        auVar37 = vpinsrb_avx(auVar37,gap * 0xfa - open,9);
        uVar29 = s2Len + 0x1f;
        auVar37 = vpinsrb_avx(auVar37,gap * 0xfb - open,10);
        local_314 = uVar25 - 1;
        auVar37 = vpinsrb_avx(auVar37,uVar18 + gap * -4,0xb);
        iVar24 = s2Len + -1;
        auVar39 = vpmulld_avx2(auVar50,_DAT_00909300);
        cVar16 = (char)uVar10 + -0x7f;
        auVar52[8] = 0xe0;
        auVar52._0_8_ = 0xe0e0e0e0e0e0e0e0;
        auVar52[9] = 0xe0;
        auVar52[10] = 0xe0;
        auVar52[0xb] = 0xe0;
        auVar52[0xc] = 0xe0;
        auVar52[0xd] = 0xe0;
        auVar52[0xe] = 0xe0;
        auVar52[0xf] = 0xe0;
        auVar52[0x10] = 0xe0;
        auVar52[0x11] = 0xe0;
        auVar52[0x12] = 0xe0;
        auVar52[0x13] = 0xe0;
        auVar52[0x14] = 0xe0;
        auVar52[0x15] = 0xe0;
        auVar52[0x16] = 0xe0;
        auVar52[0x17] = 0xe0;
        auVar52[0x18] = 0xe0;
        auVar52[0x19] = 0xe0;
        auVar52[0x1a] = 0xe0;
        auVar52[0x1b] = 0xe0;
        auVar52[0x1c] = 0xe0;
        auVar52[0x1d] = 0xe0;
        auVar52[0x1e] = 0xe0;
        auVar52[0x1f] = 0xe0;
        auVar49[0] = (char)gap;
        auVar49[1] = auVar49[0];
        auVar49[2] = auVar49[0];
        auVar49[3] = auVar49[0];
        auVar49[4] = auVar49[0];
        auVar49[5] = auVar49[0];
        auVar49[6] = auVar49[0];
        auVar49[7] = auVar49[0];
        auVar49[8] = auVar49[0];
        auVar49[9] = auVar49[0];
        auVar49[10] = auVar49[0];
        auVar49[0xb] = auVar49[0];
        auVar49[0xc] = auVar49[0];
        auVar49[0xd] = auVar49[0];
        auVar49[0xe] = auVar49[0];
        auVar49[0xf] = auVar49[0];
        auVar49[0x10] = auVar49[0];
        auVar49[0x11] = auVar49[0];
        auVar49[0x12] = auVar49[0];
        auVar49[0x13] = auVar49[0];
        auVar49[0x14] = auVar49[0];
        auVar49[0x15] = auVar49[0];
        auVar49[0x16] = auVar49[0];
        auVar49[0x17] = auVar49[0];
        auVar49[0x18] = auVar49[0];
        auVar49[0x19] = auVar49[0];
        auVar49[0x1a] = auVar49[0];
        auVar49[0x1b] = auVar49[0];
        auVar49[0x1c] = auVar49[0];
        auVar49[0x1d] = auVar49[0];
        auVar49[0x1e] = auVar49[0];
        auVar49[0x1f] = auVar49[0];
        auVar50 = vpsllw_avx2(auVar49,5);
        auVar4 = vpand_avx2(auVar50,auVar52);
        auVar43[0] = (undefined1)uVar32;
        auVar43[1] = auVar43[0];
        auVar43[2] = auVar43[0];
        auVar43[3] = auVar43[0];
        auVar43[4] = auVar43[0];
        auVar43[5] = auVar43[0];
        auVar43[6] = auVar43[0];
        auVar43[7] = auVar43[0];
        auVar43[8] = auVar43[0];
        auVar43[9] = auVar43[0];
        auVar43[10] = auVar43[0];
        auVar43[0xb] = auVar43[0];
        auVar43[0xc] = auVar43[0];
        auVar43[0xd] = auVar43[0];
        auVar43[0xe] = auVar43[0];
        auVar43[0xf] = auVar43[0];
        auVar43[0x10] = auVar43[0];
        auVar43[0x11] = auVar43[0];
        auVar43[0x12] = auVar43[0];
        auVar43[0x13] = auVar43[0];
        auVar43[0x14] = auVar43[0];
        auVar43[0x15] = auVar43[0];
        auVar43[0x16] = auVar43[0];
        auVar43[0x17] = auVar43[0];
        auVar43[0x18] = auVar43[0];
        auVar43[0x19] = auVar43[0];
        auVar43[0x1a] = auVar43[0];
        auVar43[0x1b] = auVar43[0];
        auVar43[0x1c] = auVar43[0];
        auVar43[0x1d] = auVar43[0];
        auVar43[0x1e] = auVar43[0];
        auVar43[0x1f] = auVar43[0];
        auVar50 = vpcmpeqd_avx2(auVar52,auVar52);
        auVar43 = vpaddsb_avx2(auVar43,auVar50);
        auVar51[0] = (undefined1)s2Len;
        auVar51[1] = auVar51[0];
        auVar51[2] = auVar51[0];
        auVar51[3] = auVar51[0];
        auVar51[4] = auVar51[0];
        auVar51[5] = auVar51[0];
        auVar51[6] = auVar51[0];
        auVar51[7] = auVar51[0];
        auVar51[8] = auVar51[0];
        auVar51[9] = auVar51[0];
        auVar51[10] = auVar51[0];
        auVar51[0xb] = auVar51[0];
        auVar51[0xc] = auVar51[0];
        auVar51[0xd] = auVar51[0];
        auVar51[0xe] = auVar51[0];
        auVar51[0xf] = auVar51[0];
        auVar51[0x10] = auVar51[0];
        auVar51[0x11] = auVar51[0];
        auVar51[0x12] = auVar51[0];
        auVar51[0x13] = auVar51[0];
        auVar51[0x14] = auVar51[0];
        auVar51[0x15] = auVar51[0];
        auVar51[0x16] = auVar51[0];
        auVar51[0x17] = auVar51[0];
        auVar51[0x18] = auVar51[0];
        auVar51[0x19] = auVar51[0];
        auVar51[0x1a] = auVar51[0];
        auVar51[0x1b] = auVar51[0];
        auVar51[0x1c] = auVar51[0];
        auVar51[0x1d] = auVar51[0];
        auVar51[0x1e] = auVar51[0];
        auVar51[0x1f] = auVar51[0];
        auVar51 = vpaddsb_avx2(auVar51,auVar50);
        local_298[1] = cVar16;
        local_298[0] = cVar16;
        local_298[2] = cVar16;
        local_298[3] = cVar16;
        local_298[4] = cVar16;
        local_298[5] = cVar16;
        local_298[6] = cVar16;
        local_298[7] = cVar16;
        local_298[8] = cVar16;
        local_298[9] = cVar16;
        local_298[10] = cVar16;
        local_298[0xb] = cVar16;
        local_298[0xc] = cVar16;
        local_298[0xd] = cVar16;
        local_298[0xe] = cVar16;
        local_298[0xf] = cVar16;
        local_298[0x10] = cVar16;
        local_298[0x11] = cVar16;
        local_298[0x12] = cVar16;
        local_298[0x13] = cVar16;
        local_298[0x14] = cVar16;
        local_298[0x15] = cVar16;
        local_298[0x16] = cVar16;
        local_298[0x17] = cVar16;
        local_298[0x18] = cVar16;
        local_298[0x19] = cVar16;
        local_298[0x1a] = cVar16;
        local_298[0x1b] = cVar16;
        local_298[0x1c] = cVar16;
        local_298[0x1d] = cVar16;
        local_298[0x1e] = cVar16;
        local_298[0x1f] = cVar16;
        uVar36 = (undefined1)open;
        auVar3 = vpinsrb_avx(auVar37,gap * 0xfd - open,0xc);
        auVar38._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar41;
        auVar38._16_16_ = ZEXT116(0) * auVar42._16_16_ + ZEXT116(1) * auVar2;
        auVar50 = vpsubd_avx2(auVar34,auVar38);
        auVar39 = vpsubd_avx2(auVar39,auVar42);
        auVar45._8_4_ = 0xff;
        auVar45._0_8_ = 0xff000000ff;
        auVar45._12_4_ = 0xff;
        auVar45._16_4_ = 0xff;
        auVar45._20_4_ = 0xff;
        auVar45._24_4_ = 0xff;
        auVar45._28_4_ = 0xff;
        auVar50 = vpand_avx2(auVar50,auVar45);
        auVar39 = vpand_avx2(auVar39,auVar45);
        auVar50 = vpackusdw_avx2(auVar39,auVar50);
        auVar37 = vpackuswb_avx(auVar50._0_16_,auVar50._16_16_);
        auVar3 = vpinsrb_avx(auVar3,uVar18 + gap * -2,0xd);
        auVar3 = vpinsrb_avx(auVar3,uVar18 - gap,0xe);
        auVar3 = vpinsrb_avx(auVar3,uVar18,0xf);
        auVar37 = vpshufd_avx(auVar37,0xd8);
        local_1d8._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar37;
        local_1d8._16_16_ = ZEXT116(1) * auVar3;
        uVar20 = (ulong)(uint)s2Len;
        uVar14 = 0;
        do {
          ptr[1][uVar14 + 0xf] = (char)matrix->mapper[(byte)_s2[uVar14]];
          uVar14 = uVar14 + 1;
        } while (uVar20 != uVar14);
        *(undefined1 (*) [16])(*ptr + 0xf) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar10 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar29) {
          uVar10 = uVar29;
        }
        uVar14 = 0;
        auVar57 = ZEXT1664(auVar33);
        auVar50 = ZEXT1632(auVar58);
        memset(ptr[1] + uVar20 + 0xf,0,(ulong)(~s2Len + uVar10) + 1);
        uVar10 = uVar18;
        do {
          ptr_00[uVar14 + 0x1f] = (char)uVar10;
          ptr_01[uVar14 + 0x1f] = cVar16;
          uVar14 = uVar14 + 1;
          uVar10 = (uint)(byte)((char)uVar10 - auVar49[0]);
        } while (uVar20 != uVar14);
        lVar15 = 0;
        do {
          ptr_00[lVar15] = cVar16;
          ptr_01[lVar15] = cVar16;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x1f);
        lVar15 = uVar20 + 0x1f;
        do {
          ptr_00[lVar15] = cVar16;
          ptr_01[lVar15] = cVar16;
          lVar15 = lVar15 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar29);
        ptr_00[0x1e] = '\0';
        if ((int)uVar25 < 1) {
          auVar44 = ZEXT3264(local_298);
          auVar39[1] = cVar21;
          auVar39[0] = cVar21;
          auVar39[2] = cVar21;
          auVar39[3] = cVar21;
          auVar39[4] = cVar21;
          auVar39[5] = cVar21;
          auVar39[6] = cVar21;
          auVar39[7] = cVar21;
          auVar39[8] = cVar21;
          auVar39[9] = cVar21;
          auVar39[10] = cVar21;
          auVar39[0xb] = cVar21;
          auVar39[0xc] = cVar21;
          auVar39[0xd] = cVar21;
          auVar39[0xe] = cVar21;
          auVar39[0xf] = cVar21;
          auVar39[0x10] = cVar21;
          auVar39[0x11] = cVar21;
          auVar39[0x12] = cVar21;
          auVar39[0x13] = cVar21;
          auVar39[0x14] = cVar21;
          auVar39[0x15] = cVar21;
          auVar39[0x16] = cVar21;
          auVar39[0x17] = cVar21;
          auVar39[0x18] = cVar21;
          auVar39[0x19] = cVar21;
          auVar39[0x1a] = cVar21;
          auVar39[0x1b] = cVar21;
          auVar39[0x1c] = cVar21;
          auVar39[0x1d] = cVar21;
          auVar39[0x1e] = cVar21;
          auVar39[0x1f] = cVar21;
          auVar50 = local_298;
        }
        else {
          auVar44 = ZEXT3264(local_298);
          uVar14 = 1;
          if (1 < (int)uVar29) {
            uVar14 = (ulong)uVar29;
          }
          auVar42 = vpalignr_avx2(ZEXT1632(local_298._16_16_),local_298,1);
          auVar33._4_4_ = uVar25;
          auVar33._0_4_ = uVar25;
          auVar33._8_4_ = uVar25;
          auVar33._12_4_ = uVar25;
          auVar52 = vpmovzxdq_avx2(auVar33);
          uVar20 = 0;
          auVar45 = vpcmpeqd_avx2(auVar50,auVar50);
          auVar59[8] = 1;
          auVar59._0_8_ = 0x101010101010101;
          auVar59[9] = 1;
          auVar59[10] = 1;
          auVar59[0xb] = 1;
          auVar59[0xc] = 1;
          auVar59[0xd] = 1;
          auVar59[0xe] = 1;
          auVar59[0xf] = 1;
          auVar59[0x10] = 1;
          auVar59[0x11] = 1;
          auVar59[0x12] = 1;
          auVar59[0x13] = 1;
          auVar59[0x14] = 1;
          auVar59[0x15] = 1;
          auVar59[0x16] = 1;
          auVar59[0x17] = 1;
          auVar59[0x18] = 1;
          auVar59[0x19] = 1;
          auVar59[0x1a] = 1;
          auVar59[0x1b] = 1;
          auVar59[0x1c] = 1;
          auVar59[0x1d] = 1;
          auVar59[0x1e] = 1;
          auVar59[0x1f] = 1;
          auVar40 = ZEXT3264(CONCAT131(cVar21,CONCAT130(cVar21,CONCAT129(cVar21,CONCAT128(cVar21,
                                                  CONCAT127(cVar21,CONCAT126(cVar21,CONCAT125(cVar21
                                                  ,CONCAT124(cVar21,CONCAT123(cVar21,CONCAT122(
                                                  cVar21,CONCAT121(cVar21,CONCAT120(cVar21,CONCAT119
                                                  (cVar21,CONCAT118(cVar21,CONCAT117(cVar21,
                                                  CONCAT116(cVar21,CONCAT115(cVar21,CONCAT114(cVar21
                                                  ,CONCAT113(cVar21,CONCAT112(cVar21,CONCAT111(
                                                  cVar21,CONCAT110(cVar21,CONCAT19(cVar21,CONCAT18(
                                                  cVar21,CONCAT17(cVar21,CONCAT16(cVar21,CONCAT15(
                                                  cVar21,CONCAT14(cVar21,CONCAT13(cVar21,CONCAT12(
                                                  cVar21,CONCAT11(cVar21,cVar21)))))))))))))))))))))
                                                  )))))))))));
          auVar35 = ZEXT3264(local_298);
          auVar38 = _DAT_00909020;
          do {
            auVar50 = auVar57._32_32_;
            uVar10 = (uint)uVar20;
            if (matrix->type == 0) {
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(local_2b8 + uVar20 + 9);
              auVar39 = vpmovsxbd_avx2(auVar58);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(local_2b8 + uVar20 + 1);
              auVar5 = vpmovsxbd_avx2(auVar3);
              local_310 = (uint)local_2b8[uVar20 + 0x11];
              uVar29 = (uint)local_2b8[uVar20 + 0x12];
              uVar30 = (uint)local_2b8[uVar20 + 0x13];
              uVar27 = (uint)local_2b8[uVar20 + 0x14];
              uVar28 = (uint)local_2b8[uVar20 + 0x15];
              uVar22 = (uint)local_2b8[uVar20 + 0x16];
              uVar11 = (uint)local_2b8[uVar20 + 0x17];
              local_2e8 = (uint)local_2b8[uVar20 + 0x18];
              uVar17 = (uint)local_2b8[uVar20 + 0x19];
              local_2f0 = (uint)local_2b8[uVar20 + 0x1a];
              uVar19 = (uint)local_2b8[uVar20 + 0x1b];
              local_300 = (uint)local_2b8[uVar20 + 0x1c];
              uVar23 = (uint)local_2b8[uVar20 + 0x1d];
              local_2f8 = (uint)local_2b8[uVar20 + 0x1e];
              local_2d8 = (uint)local_2b8[uVar20 + 0x1f];
              uVar25 = (int)local_2b8[uVar20];
            }
            else {
              auVar47._8_8_ = uVar20;
              auVar47._0_8_ = uVar20;
              auVar47._16_8_ = uVar20;
              auVar47._24_8_ = uVar20;
              auVar5 = vpor_avx2(auVar47,_DAT_00909320);
              auVar53 = vpor_avx2(auVar47,_DAT_00909340);
              auVar62 = vpor_avx2(auVar47,_DAT_00908b80);
              auVar47 = vpor_avx2(auVar47,_DAT_00909360);
              auVar60._8_8_ = 0x8000000000000000;
              auVar60._0_8_ = 0x8000000000000000;
              auVar60._16_8_ = 0x8000000000000000;
              auVar60._24_8_ = 0x8000000000000000;
              auVar6 = vpor_avx2(auVar60,auVar52);
              auVar50 = vpcmpgtq_avx2(auVar6,auVar60 ^ auVar47);
              auVar39 = vpcmpgtq_avx2(auVar6,auVar62 ^ auVar60);
              auVar50 = vpackssdw_avx2(auVar39,auVar50);
              auVar7 = vpermq_avx2(auVar50,0xd8);
              auVar50 = vpcmpgtq_avx2(auVar6,auVar53 ^ auVar60);
              auVar39 = vpcmpgtq_avx2(auVar6,auVar60 ^ auVar5);
              auVar50 = vpackssdw_avx2(auVar39,auVar50);
              auVar6 = vpermq_avx2(auVar50,0xd8);
              auVar39 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
              auVar62 = vpermd_avx2(auVar39,auVar62);
              auVar50 = (undefined1  [32])0x0;
              auVar47 = vpermd_avx2(auVar39,auVar47);
              auVar48._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar62._0_16_;
              auVar48._16_16_ = ZEXT116(0) * auVar62._16_16_ + ZEXT116(1) * auVar47._0_16_;
              auVar5 = vpermd_avx2(auVar39,auVar5);
              auVar39 = vpermd_avx2(auVar39,auVar53);
              auVar53._0_16_ = ZEXT116(0) * auVar39._0_16_ + ZEXT116(1) * auVar5._0_16_;
              auVar53._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar39._0_16_;
              auVar5._4_4_ = local_314;
              auVar5._0_4_ = local_314;
              auVar5._8_4_ = local_314;
              auVar5._12_4_ = local_314;
              auVar5._16_4_ = local_314;
              auVar5._20_4_ = local_314;
              auVar5._24_4_ = local_314;
              auVar5._28_4_ = local_314;
              auVar39 = vblendvps_avx(auVar5,auVar53,auVar6);
              auVar5 = vblendvps_avx(auVar5,auVar48,auVar7);
              local_310 = uVar10 | 0x11;
              if (uVar32 <= (uVar20 | 0x11)) {
                local_310 = local_314;
              }
              uVar29 = uVar10 | 0x12;
              if (uVar32 <= (uVar20 | 0x12)) {
                uVar29 = local_314;
              }
              uVar30 = uVar10 | 0x13;
              if (uVar32 <= (uVar20 | 0x13)) {
                uVar30 = local_314;
              }
              uVar27 = uVar10 | 0x14;
              if (uVar32 <= (uVar20 | 0x14)) {
                uVar27 = local_314;
              }
              uVar28 = uVar10 | 0x15;
              if (uVar32 <= (uVar20 | 0x15)) {
                uVar28 = local_314;
              }
              uVar22 = uVar10 | 0x16;
              if (uVar32 <= (uVar20 | 0x16)) {
                uVar22 = local_314;
              }
              uVar11 = uVar10 | 0x17;
              if (uVar32 <= (uVar20 | 0x17)) {
                uVar11 = local_314;
              }
              local_2e8 = uVar10 | 0x18;
              if (uVar32 <= (uVar20 | 0x18)) {
                local_2e8 = local_314;
              }
              uVar17 = uVar10 | 0x19;
              if (uVar32 <= (uVar20 | 0x19)) {
                uVar17 = local_314;
              }
              local_2f0 = uVar10 | 0x1a;
              if (uVar32 <= (uVar20 | 0x1a)) {
                local_2f0 = local_314;
              }
              uVar19 = uVar10 | 0x1b;
              if (uVar32 <= (uVar20 | 0x1b)) {
                uVar19 = local_314;
              }
              local_300 = uVar10 | 0x1c;
              if (uVar32 <= (uVar20 | 0x1c)) {
                local_300 = local_314;
              }
              uVar23 = uVar10 | 0x1d;
              if (uVar32 <= (uVar20 | 0x1d)) {
                uVar23 = local_314;
              }
              local_2f8 = uVar10 | 0x1e;
              if (uVar32 <= (uVar20 | 0x1e)) {
                local_2f8 = local_314;
              }
              local_2d8 = uVar10 | 0x1f;
              uVar25 = uVar10;
              if (uVar32 <= (uVar20 | 0x1f)) {
                local_2d8 = local_314;
              }
            }
            iVar12 = matrix->size;
            iVar31 = vextractps_avx(auVar39._16_16_,3);
            piVar1 = matrix->matrix;
            auVar7._8_8_ = 0x500000003;
            auVar7._0_8_ = 0x100000007;
            auVar7._16_8_ = 0x100000007;
            auVar7._24_8_ = 0x500000003;
            auVar53 = vpermps_avx2(auVar7,auVar5);
            auVar6._8_8_ = 0x500000003;
            auVar6._0_8_ = 0x100000000;
            auVar6._16_8_ = 0x100000000;
            auVar6._24_8_ = 0x500000003;
            auVar62 = vpermps_avx2(auVar6,auVar39);
            auVar53 = vblendps_avx(auVar53,auVar62,0xe0);
            auVar39 = vshufps_avx(auVar39,auVar5,0x22);
            auVar5 = vpermpd_avx2(auVar39,0x72);
            auVar39 = vblendps_avx(auVar53,ZEXT432(uVar25),1);
            auVar54._4_4_ = iVar12;
            auVar54._0_4_ = iVar12;
            auVar54._8_4_ = iVar12;
            auVar54._12_4_ = iVar12;
            auVar54._16_4_ = iVar12;
            auVar54._20_4_ = iVar12;
            auVar54._24_4_ = iVar12;
            auVar54._28_4_ = iVar12;
            auVar7 = vpmulld_avx2(auVar39,auVar54);
            auVar48 = vpmulld_avx2(auVar5,auVar54);
            uVar20 = uVar20 + 0x20;
            auVar58 = auVar42._16_16_;
            auVar33 = vpinsrb_avx(auVar58,(uint)(byte)ptr_00[0x1e],0xf);
            ptr_00[0x1e] = auVar34[0x1c] - (char)uVar20 * auVar49[0];
            auVar37 = vpinsrb_avx(auVar58,uVar18 - uVar10 * gap,0xf);
            auVar62._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar42._0_16_;
            auVar62._16_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar37;
            auVar57._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar42._0_16_;
            auVar57._16_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar33;
            auVar57._32_32_ = auVar50;
            auVar6 = vpcmpeqb_avx2(auVar38,auVar43);
            uVar26 = 0;
            auVar5 = _DAT_00909380;
            auVar47 = local_298;
            auVar53 = local_298;
            do {
              auVar33 = vpinsrb_avx(ZEXT416((uint)piVar1[(long)auVar48._0_4_ +
                                                         (long)(char)ptr[1][uVar26]]),
                                    (uint)*(byte *)(piVar1 + (long)auVar7._28_4_ +
                                                             (long)(char)ptr[1][uVar26 + 1]),1);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar48._4_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 2])
                                    ,2);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar7._24_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 3])
                                    ,3);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar48._8_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 4])
                                    ,4);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar7._20_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 5])
                                    ,5);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar48._12_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 6])
                                    ,6);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar7._16_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 7])
                                    ,7);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar48._16_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 8])
                                    ,8);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar7._12_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 9])
                                    ,9);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar48._20_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 10]
                                                           ),10);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar7._8_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 0xb
                                                                                       ]),0xb);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar48._24_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 0xc
                                                                                       ]),0xc);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar7._4_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 0xd
                                                                                       ]),0xd);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar48._28_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 0xe
                                                                                       ]),0xe);
              auVar33 = vpinsrb_avx(auVar33,(uint)*(byte *)(piVar1 + (long)auVar7._0_4_ +
                                                                     (long)(char)ptr[1][uVar26 + 0xf
                                                                                       ]),0xf);
              auVar37 = vpinsrb_avx(ZEXT416((uint)piVar1[(long)(int)(local_2d8 * iVar12) +
                                                         (long)(char)(*ptr)[uVar26]]),
                                    (uint)*(byte *)(piVar1 + (long)(int)(local_2f8 * iVar12) +
                                                             (long)(char)(*ptr)[uVar26 + 1]),1);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar23 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 2])
                                    ,2);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(local_300 * iVar12)
                                                                     + (long)(char)(*ptr)[uVar26 + 3
                                                                                         ]),3);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar19 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 4])
                                    ,4);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(local_2f0 * iVar12)
                                                                     + (long)(char)(*ptr)[uVar26 + 5
                                                                                         ]),5);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar17 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 6])
                                    ,6);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(local_2e8 * iVar12)
                                                                     + (long)(char)(*ptr)[uVar26 + 7
                                                                                         ]),7);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar11 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 8])
                                    ,8);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar22 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 9])
                                    ,9);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar28 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 10]
                                                           ),10);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar27 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 0xb
                                                                                       ]),0xb);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar30 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 0xc
                                                                                       ]),0xc);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(uVar29 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 0xd
                                                                                       ]),0xd);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(int)(local_310 * iVar12)
                                                                     + (long)(char)(*ptr)[uVar26 + 
                                                  0xe]),0xe);
              auVar37 = vpinsrb_avx(auVar37,(uint)*(byte *)(piVar1 + (long)(iVar31 * iVar12) +
                                                                     (long)(char)(*ptr)[uVar26 + 0xf
                                                                                       ]),0xf);
              auVar61[0] = auVar62[0x10];
              auVar61[1] = auVar61[0];
              auVar61[2] = auVar61[0];
              auVar61[3] = auVar61[0];
              auVar61[4] = auVar61[0];
              auVar61[5] = auVar61[0];
              auVar61[6] = auVar61[0];
              auVar61[7] = auVar61[0];
              auVar61[8] = auVar61[0];
              auVar61[9] = auVar61[0];
              auVar61[10] = auVar61[0];
              auVar61[0xb] = auVar61[0];
              auVar61[0xc] = auVar61[0];
              auVar61[0xd] = auVar61[0];
              auVar61[0xe] = auVar61[0];
              auVar61[0xf] = auVar61[0];
              auVar61[0x10] = auVar61[0];
              auVar61[0x11] = auVar61[0];
              auVar61[0x12] = auVar61[0];
              auVar61[0x13] = auVar61[0];
              auVar61[0x14] = auVar61[0];
              auVar61[0x15] = auVar61[0];
              auVar61[0x16] = auVar61[0];
              auVar61[0x17] = auVar61[0];
              auVar61[0x18] = auVar61[0];
              auVar61[0x19] = auVar61[0];
              auVar61[0x1a] = auVar61[0];
              auVar61[0x1b] = auVar61[0];
              auVar61[0x1c] = auVar61[0];
              auVar61[0x1d] = auVar61[0];
              auVar61[0x1e] = auVar61[0];
              auVar61[0x1f] = auVar61[0];
              auVar39 = vpalignr_avx2(auVar61,auVar62,1);
              auVar46._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar37;
              auVar46._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33
              ;
              auVar33 = vpinsrb_avx(auVar39._16_16_,(uint)(byte)ptr_00[uVar26 + 0x1f],0xf);
              auVar50 = vpaddsb_avx2(auVar57._0_32_,auVar46);
              auVar56._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar39._0_16_;
              auVar56._16_16_ = ZEXT116(0) * auVar39._16_16_ + ZEXT116(1) * auVar33;
              auVar57._0_32_ = auVar56;
              auVar39 = vpalignr_avx2(ZEXT1632(auVar53._16_16_),auVar53,1);
              auVar33 = vpinsrb_avx(auVar39._16_16_,(uint)(byte)ptr_01[uVar26 + 0x1f],0xf);
              auVar55._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar39._0_16_;
              auVar55._16_16_ = ZEXT116(0) * auVar39._16_16_ + ZEXT116(1) * auVar33;
              auVar9[1] = uVar36;
              auVar9[0] = uVar36;
              auVar9[2] = uVar36;
              auVar9[3] = uVar36;
              auVar9[4] = uVar36;
              auVar9[5] = uVar36;
              auVar9[6] = uVar36;
              auVar9[7] = uVar36;
              auVar9[8] = uVar36;
              auVar9[9] = uVar36;
              auVar9[10] = uVar36;
              auVar9[0xb] = uVar36;
              auVar9[0xc] = uVar36;
              auVar9[0xd] = uVar36;
              auVar9[0xe] = uVar36;
              auVar9[0xf] = uVar36;
              auVar9[0x10] = uVar36;
              auVar9[0x11] = uVar36;
              auVar9[0x12] = uVar36;
              auVar9[0x13] = uVar36;
              auVar9[0x14] = uVar36;
              auVar9[0x15] = uVar36;
              auVar9[0x16] = uVar36;
              auVar9[0x17] = uVar36;
              auVar9[0x18] = uVar36;
              auVar9[0x19] = uVar36;
              auVar9[0x1a] = uVar36;
              auVar9[0x1b] = uVar36;
              auVar9[0x1c] = uVar36;
              auVar9[0x1d] = uVar36;
              auVar9[0x1e] = uVar36;
              auVar9[0x1f] = uVar36;
              auVar39 = vpsubsb_avx2(auVar56,auVar9);
              auVar53 = vpsubsb_avx2(auVar55,auVar49);
              auVar53 = vpmaxsb_avx2(auVar39,auVar53);
              auVar39 = vpsubsb_avx2(auVar62,auVar9);
              auVar62 = vpsubsb_avx2(auVar47,auVar49);
              auVar60 = vpmaxsb_avx2(auVar39,auVar62);
              auVar39 = vpmaxsb_avx2(auVar60,auVar53);
              auVar50 = vpmaxsb_avx2(auVar50,auVar39);
              auVar47 = vpcmpeqb_avx2(auVar45,auVar5);
              auVar62 = vpblendvb_avx2(auVar50,local_1d8,auVar47);
              if (0x1f < uVar26) {
                auVar50 = vpminsb_avx2(auVar40._0_32_,auVar62);
                auVar40 = ZEXT3264(auVar50);
                auVar50 = vpmaxsb_avx2(auVar35._0_32_,auVar62);
                auVar35 = ZEXT3264(auVar50);
              }
              auVar50 = auVar35._0_32_;
              auVar39 = auVar40._0_32_;
              auVar53 = vpblendvb_avx2(auVar53,local_298,auVar47);
              auVar47 = vpblendvb_avx2(auVar60,local_298,auVar47);
              ptr_00[uVar26] = auVar62[0];
              ptr_01[uVar26] = auVar53[0];
              auVar60 = vpcmpeqb_avx2(auVar5,auVar51);
              auVar60 = vpand_avx2(auVar6,auVar60);
              auVar60 = vpblendvb_avx2(auVar44._0_32_,auVar62,auVar60);
              auVar44 = ZEXT3264(auVar60);
              auVar5 = vpaddsb_avx2(auVar59,auVar5);
              uVar26 = uVar26 + 1;
            } while (uVar14 != uVar26);
            auVar8[8] = 0x20;
            auVar8._0_8_ = 0x2020202020202020;
            auVar8[9] = 0x20;
            auVar8[10] = 0x20;
            auVar8[0xb] = 0x20;
            auVar8[0xc] = 0x20;
            auVar8[0xd] = 0x20;
            auVar8[0xe] = 0x20;
            auVar8[0xf] = 0x20;
            auVar8[0x10] = 0x20;
            auVar8[0x11] = 0x20;
            auVar8[0x12] = 0x20;
            auVar8[0x13] = 0x20;
            auVar8[0x14] = 0x20;
            auVar8[0x15] = 0x20;
            auVar8[0x16] = 0x20;
            auVar8[0x17] = 0x20;
            auVar8[0x18] = 0x20;
            auVar8[0x19] = 0x20;
            auVar8[0x1a] = 0x20;
            auVar8[0x1b] = 0x20;
            auVar8[0x1c] = 0x20;
            auVar8[0x1d] = 0x20;
            auVar8[0x1e] = 0x20;
            auVar8[0x1f] = 0x20;
            auVar38 = vpaddsb_avx2(auVar38,auVar8);
            local_1d8 = vpsubsb_avx2(local_1d8,auVar4);
          } while (uVar20 < uVar32);
        }
        iVar12 = 0x20;
        do {
          if (cVar16 < auVar44[0x17]) {
            cVar16 = auVar44[0x17];
          }
          auVar43 = auVar44._0_32_;
          auVar34 = vperm2i128_avx2(auVar43,auVar43,0x28);
          auVar34 = vpalignr_avx2(auVar43,auVar34,0xf);
          auVar44 = ZEXT3264(auVar34);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        auVar34 = vpcmpgtb_avx2(local_298,auVar39);
        auVar4[1] = cVar21;
        auVar4[0] = cVar21;
        auVar4[2] = cVar21;
        auVar4[3] = cVar21;
        auVar4[4] = cVar21;
        auVar4[5] = cVar21;
        auVar4[6] = cVar21;
        auVar4[7] = cVar21;
        auVar4[8] = cVar21;
        auVar4[9] = cVar21;
        auVar4[10] = cVar21;
        auVar4[0xb] = cVar21;
        auVar4[0xc] = cVar21;
        auVar4[0xd] = cVar21;
        auVar4[0xe] = cVar21;
        auVar4[0xf] = cVar21;
        auVar4[0x10] = cVar21;
        auVar4[0x11] = cVar21;
        auVar4[0x12] = cVar21;
        auVar4[0x13] = cVar21;
        auVar4[0x14] = cVar21;
        auVar4[0x15] = cVar21;
        auVar4[0x16] = cVar21;
        auVar4[0x17] = cVar21;
        auVar4[0x18] = cVar21;
        auVar4[0x19] = cVar21;
        auVar4[0x1a] = cVar21;
        auVar4[0x1b] = cVar21;
        auVar4[0x1c] = cVar21;
        auVar4[0x1d] = cVar21;
        auVar4[0x1e] = cVar21;
        auVar4[0x1f] = cVar21;
        auVar50 = vpcmpgtb_avx2(auVar50,auVar4);
        auVar34 = vpor_avx2(auVar34,auVar50);
        if ((((((((((((((((((((((((((((((((auVar34 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar34 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar34 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar34 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar34 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar34 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar34 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar34 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar34 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar34 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar34 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar34 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar34 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar34 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar34 >> 0x7f,0) != '\0') ||
                          (auVar34 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar34 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar34 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar34 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar34 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar34 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar34 >> 0xbf,0) != '\0') ||
                  (auVar34 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar34 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar34 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar34 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar34 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar34 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar34[0x1f] < '\0') {
          *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
          cVar16 = '\0';
          iVar24 = 0;
          local_314 = 0;
        }
        ppVar13->score = (int)cVar16;
        ppVar13->end_query = local_314;
        ppVar13->end_ref = iVar24;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_2b8);
          return ppVar13;
        }
        return ppVar13;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 32; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi8(NEG_LIMIT);
    vOpen = _mm256_set1_epi8(open);
    vGap  = _mm256_set1_epi8(gap);
    vOne = _mm256_set1_epi8(1);
    vN = _mm256_set1_epi8(N);
    vGapN = _mm256_set1_epi8(gap*N);
    vNegOne = _mm256_set1_epi8(-1);
    vI = _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31);
    vJreset = _mm256_set_epi8(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15,-16,-17,-18,-19,-20,-21,-22,-23,-24,-25,-26,-27,-28,-29,-30,-31);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi8(s1Len);
    vILimit1 = _mm256_subs_epi8(vILimit, vOne);
    vJLimit = _mm256_set1_epi8(s2Len);
    vJLimit1 = _mm256_subs_epi8(vJLimit, vOne);
    vIBoundary = _mm256_set_epi8(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap,
            -open-16*gap,
            -open-17*gap,
            -open-18*gap,
            -open-19*gap,
            -open-20*gap,
            -open-21*gap,
            -open-22*gap,
            -open-23*gap,
            -open-24*gap,
            -open-25*gap,
            -open-26*gap,
            -open-27*gap,
            -open-28*gap,
            -open-29*gap,
            -open-30*gap,
            -open-31*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        const int * const restrict matrow16 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+16] : ((i+16 >= s1Len) ? s1Len-1 : i+16))];
        const int * const restrict matrow17 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+17] : ((i+17 >= s1Len) ? s1Len-1 : i+17))];
        const int * const restrict matrow18 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+18] : ((i+18 >= s1Len) ? s1Len-1 : i+18))];
        const int * const restrict matrow19 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+19] : ((i+19 >= s1Len) ? s1Len-1 : i+19))];
        const int * const restrict matrow20 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+20] : ((i+20 >= s1Len) ? s1Len-1 : i+20))];
        const int * const restrict matrow21 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+21] : ((i+21 >= s1Len) ? s1Len-1 : i+21))];
        const int * const restrict matrow22 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+22] : ((i+22 >= s1Len) ? s1Len-1 : i+22))];
        const int * const restrict matrow23 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+23] : ((i+23 >= s1Len) ? s1Len-1 : i+23))];
        const int * const restrict matrow24 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+24] : ((i+24 >= s1Len) ? s1Len-1 : i+24))];
        const int * const restrict matrow25 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+25] : ((i+25 >= s1Len) ? s1Len-1 : i+25))];
        const int * const restrict matrow26 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+26] : ((i+26 >= s1Len) ? s1Len-1 : i+26))];
        const int * const restrict matrow27 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+27] : ((i+27 >= s1Len) ? s1Len-1 : i+27))];
        const int * const restrict matrow28 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+28] : ((i+28 >= s1Len) ? s1Len-1 : i+28))];
        const int * const restrict matrow29 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+29] : ((i+29 >= s1Len) ? s1Len-1 : i+29))];
        const int * const restrict matrow30 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+30] : ((i+30 >= s1Len) ? s1Len-1 : i+30))];
        const int * const restrict matrow31 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+31] : ((i+31 >= s1Len) ? s1Len-1 : i+31))];
        vNH = _mm256_srli_si256_rpl(vNH, 1);
        vNH = _mm256_insert_epi8_rpl(vNH, H_pr[-1], 31);
        vWH = _mm256_srli_si256_rpl(vWH, 1);
        vWH = _mm256_insert_epi8_rpl(vWH, -open - i*gap, 31);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 1);
            vNH = _mm256_insert_epi8_rpl(vNH, H_pr[j], 31);
            vF = _mm256_srli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, F_pr[j], 31);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vNH, vOpen),
                    _mm256_subs_epi8(vF, vGap));
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vWH, vOpen),
                    _mm256_subs_epi8(vE, vGap));
            vMat = _mm256_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]],
                    matrow16[s2[j-16]],
                    matrow17[s2[j-17]],
                    matrow18[s2[j-18]],
                    matrow19[s2[j-19]],
                    matrow20[s2[j-20]],
                    matrow21[s2[j-21]],
                    matrow22[s2[j-22]],
                    matrow23[s2[j-23]],
                    matrow24[s2[j-24]],
                    matrow25[s2[j-25]],
                    matrow26[s2[j-26]],
                    matrow27[s2[j-27]],
                    matrow28[s2[j-28]],
                    matrow29[s2[j-29]],
                    matrow30[s2[j-30]],
                    matrow31[s2[j-31]]
                    );
            vNWH = _mm256_adds_epi8(vNWH, vMat);
            vWH = _mm256_max_epi8(vNWH, vE);
            vWH = _mm256_max_epi8(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi8(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vWH,0);
            F_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi8(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi8(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi8(vJ, vOne);
        }
        vI = _mm256_adds_epi8(vI, vN);
        vIBoundary = _mm256_subs_epi8(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int8_t value;
        value = (int8_t) _mm256_extract_epi8_rpl(vMax, 31);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 1);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}